

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::AdvancedSSOSimple::Run(AdvancedSSOSimple *this)

{
  CallLogWrapper *pCVar1;
  pointer *ppVVar2;
  GLsizei width;
  uint uVar3;
  bool bVar4;
  int iVar5;
  GLuint GVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ShaderImageLoadStoreBase *this_00;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data_b;
  undefined8 local_40;
  undefined8 uStack_38;
  
  bVar4 = ShaderImageLoadStoreBase::IsVSFSAvailable(&this->super_ShaderImageLoadStoreBase,0,2);
  lVar9 = 0x10;
  if (bVar4) {
    if (this->pipeline == true) {
      pCVar1 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper;
      glu::CallLogWrapper::glUseProgramStages(pCVar1,this->m_pipeline[0],1,this->m_vsp);
      glu::CallLogWrapper::glUseProgramStages(pCVar1,this->m_pipeline[0],2,this->m_fsp0);
      glu::CallLogWrapper::glUseProgramStages(pCVar1,this->m_pipeline[1],1,this->m_vsp);
      glu::CallLogWrapper::glUseProgramStages(pCVar1,this->m_pipeline[1],2,this->m_fsp1);
    }
    pCVar1 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper;
    glu::CallLogWrapper::glBindTexture(pCVar1,0x8c1a,this->m_texture);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c1a,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c1a,0x2800,0x2600);
    iVar5 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    width = *(GLsizei *)CONCAT44(extraout_var,iVar5);
    iVar5 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    glu::CallLogWrapper::glTexStorage3D
              (pCVar1,0x8c1a,1,0x8814,width,*(GLsizei *)(CONCAT44(extraout_var_00,iVar5) + 4),8);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,0,this->m_texture,0,'\0',6,0x88ba,0x8814);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,1,this->m_texture,0,'\0',4,0x88ba,0x8814);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,2,this->m_texture,0,'\0',1,0x88ba,0x8814);
    iVar5 = 3;
    glu::CallLogWrapper::glBindImageTexture(pCVar1,3,this->m_texture,0,'\0',3,0x88ba,0x8814);
    glu::CallLogWrapper::glBindVertexArray(pCVar1,this->m_vao);
    if (this->pipeline == true) {
      glu::CallLogWrapper::glBindProgramPipeline(pCVar1,this->m_pipeline[0]);
    }
    else {
      glu::CallLogWrapper::glUseProgram(pCVar1,this->m_program[0]);
    }
    glu::CallLogWrapper::glDrawArraysInstanced(pCVar1,5,0,4,1);
    if (this->pipeline == true) {
      glu::CallLogWrapper::glBindProgramPipeline(pCVar1,this->m_pipeline[1]);
    }
    else {
      glu::CallLogWrapper::glUseProgram(pCVar1,this->m_program[1]);
    }
    glu::CallLogWrapper::glDrawArrays(pCVar1,5,0,4);
    ppVVar2 = &data_b.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    data_b.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)ppVVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&data_b,
               "\n#define KSIZE 4\nlayout (local_size_x = KSIZE, local_size_y = KSIZE) in;\nlayout(rgba32f, binding = 0) readonly uniform image2D g_image[4];\nlayout(std430) buffer OutputBuffer {\n  uvec4 counter;\n  vec4 data[];\n};\nvoid main() {\n  uint idx = atomicAdd(counter[0], 1u);\n  data[idx][0] = (imageLoad(g_image[0], ivec2(gl_GlobalInvocationID))).z;\n  data[idx][1] = (imageLoad(g_image[1], ivec2(gl_GlobalInvocationID))).z;\n  data[idx][2] = (imageLoad(g_image[2], ivec2(gl_GlobalInvocationID))).z;\n  data[idx][3] = (imageLoad(g_image[3], ivec2(gl_GlobalInvocationID))).z;\n}"
               ,"");
    GVar6 = ShaderImageLoadStoreBase::CreateComputeProgram
                      (&this->super_ShaderImageLoadStoreBase,(string *)&data_b,false);
    this->c_program = GVar6;
    if (data_b.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)ppVVar2) {
      operator_delete(data_b.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)(data_b.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1
                             ));
    }
    glu::CallLogWrapper::glUseProgram(pCVar1,this->c_program);
    iVar7 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    uVar8 = *(uint *)CONCAT44(extraout_var_01,iVar7);
    uVar3 = uVar8 + 3;
    if (-1 < (int)uVar8) {
      uVar3 = uVar8;
    }
    uVar10 = uVar3 & 0xfffffffc;
    iVar7 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    uVar8 = *(uint *)(CONCAT44(extraout_var_02,iVar7) + 4);
    uVar11 = uVar8 + 3;
    if (-1 < (int)uVar8) {
      uVar11 = uVar8;
    }
    uVar12 = uVar11 & 0xfffffffc;
    uVar8 = uVar12;
    if ((int)uVar10 < (int)uVar12) {
      uVar8 = uVar10;
    }
    iVar7 = uVar12 * uVar10 + 1;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&data_b,(long)iVar7,(allocator_type *)&local_40);
    glu::CallLogWrapper::glGenBuffers(pCVar1,1,&this->m_buffer);
    glu::CallLogWrapper::glBindBufferBase(pCVar1,0x90d2,0,this->m_buffer);
    glu::CallLogWrapper::glBufferData
              (pCVar1,0x90d2,(long)(iVar7 * 0x10),
               data_b.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e4);
    glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x20);
    glu::CallLogWrapper::glDispatchCompute(pCVar1,(int)uVar3 >> 2,(int)uVar11 >> 2,1);
    glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x200);
    this_00 = (ShaderImageLoadStoreBase *)
              glu::CallLogWrapper::glMapBufferRange
                        (pCVar1,0x90d2,0x10,(long)(int)(uVar12 * uVar10 * 0x10),1);
    local_40 = 0x4130000041200000;
    uStack_38 = 0x42ca000042c80000;
    bVar4 = glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            CompareValues<tcu::Vector<float,4>>
                      (this_00,(Vector<float,_4> *)(ulong)uVar8,(int)&local_40,
                       (Vector<float,_4> *)0x0,1,iVar5);
    if (data_b.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(data_b.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)data_b.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)data_b.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    lVar9 = (ulong)bVar4 - 1;
  }
  return lVar9;
}

Assistant:

virtual long Run()
	{
		if (!IsVSFSAvailable(0, 2))
			return NOT_SUPPORTED;
		const int kSize = 4;

		if (pipeline)
		{
			glUseProgramStages(m_pipeline[0], GL_VERTEX_SHADER_BIT, m_vsp);
			glUseProgramStages(m_pipeline[0], GL_FRAGMENT_SHADER_BIT, m_fsp0);
			glUseProgramStages(m_pipeline[1], GL_VERTEX_SHADER_BIT, m_vsp);
			glUseProgramStages(m_pipeline[1], GL_FRAGMENT_SHADER_BIT, m_fsp1);
		}
		glBindTexture(GL_TEXTURE_2D_ARRAY, m_texture);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage3D(GL_TEXTURE_2D_ARRAY, 1, GL_RGBA32F, getWindowWidth(), getWindowHeight(), 8);

		glBindImageTexture(0, m_texture, 0, GL_FALSE, 6, GL_READ_WRITE, GL_RGBA32F);
		glBindImageTexture(1, m_texture, 0, GL_FALSE, 4, GL_READ_WRITE, GL_RGBA32F);
		glBindImageTexture(2, m_texture, 0, GL_FALSE, 1, GL_READ_WRITE, GL_RGBA32F);
		glBindImageTexture(3, m_texture, 0, GL_FALSE, 3, GL_READ_WRITE, GL_RGBA32F);

		glBindVertexArray(m_vao);
		if (pipeline)
			glBindProgramPipeline(m_pipeline[0]);
		else
			glUseProgram(m_program[0]);
		glDrawArraysInstanced(GL_TRIANGLE_STRIP, 0, 4, 1);

		if (pipeline)
			glBindProgramPipeline(m_pipeline[1]);
		else
			glUseProgram(m_program[1]);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		const char* const glsl_cs =
			NL "#define KSIZE 4" NL "layout (local_size_x = KSIZE, local_size_y = KSIZE) in;" NL
			   "layout(rgba32f, binding = 0) readonly uniform image2D g_image[4];" NL
			   "layout(std430) buffer OutputBuffer {" NL "  uvec4 counter;" NL "  vec4 data[];" NL "};" NL
			   "void main() {" NL "  uint idx = atomicAdd(counter[0], 1u);" NL
			   "  data[idx][0] = (imageLoad(g_image[0], ivec2(gl_GlobalInvocationID))).z;" NL
			   "  data[idx][1] = (imageLoad(g_image[1], ivec2(gl_GlobalInvocationID))).z;" NL
			   "  data[idx][2] = (imageLoad(g_image[2], ivec2(gl_GlobalInvocationID))).z;" NL
			   "  data[idx][3] = (imageLoad(g_image[3], ivec2(gl_GlobalInvocationID))).z;" NL "}";
		c_program = CreateComputeProgram(glsl_cs);
		glUseProgram(c_program);
		int wsx   = (getWindowWidth() / kSize) * kSize;
		int wsy   = (getWindowHeight() / kSize) * kSize;
		int minor = wsx > wsy ? wsy : wsx;

		std::vector<vec4> data_b(wsx * wsy + 1);
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (wsx * wsy + 1) * 4 * 4, &data_b[0], GL_STATIC_DRAW);

		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		glDispatchCompute(wsx / kSize, wsy / kSize, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		vec4* map_data = (vec4*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 4 * 4, wsx * wsy * 4 * 4, GL_MAP_READ_BIT);

		if (!CompareValues(map_data, minor, vec4(10, 11, 100, 101)))
			return ERROR;
		return NO_ERROR;
	}